

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperOpFailure<double,double>
          (char *expr1,char *expr2,double *val1,double *val2,char *op)

{
  AssertionResult *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult *in_RDI;
  AssertionResult AVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  AssertionResult *this;
  string local_80 [24];
  AssertionResult *in_stack_ffffffffffffff98;
  AssertionResult *in_stack_ffffffffffffffa0;
  
  this = in_RDI;
  AssertionFailure();
  AssertionResult::operator<<(this,(char (*) [12])in_stack_ffffffffffffff68);
  AssertionResult::operator<<(this,(char **)in_stack_ffffffffffffff68);
  AssertionResult::operator<<(this,(char (*) [3])in_stack_ffffffffffffff68);
  AssertionResult::operator<<(this,(char **)in_stack_ffffffffffffff68);
  AssertionResult::operator<<(this,(char (*) [3])in_stack_ffffffffffffff68);
  AssertionResult::operator<<(this,(char **)in_stack_ffffffffffffff68);
  pAVar1 = AssertionResult::operator<<(this,(char (*) [12])in_stack_ffffffffffffff68);
  FormatForComparisonFailureMessage<double,double>
            ((double *)in_stack_ffffffffffffff68,(double *)pAVar1);
  AssertionResult::operator<<(this,in_stack_ffffffffffffff68);
  value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          AssertionResult::operator<<(this,(char (*) [5])in_stack_ffffffffffffff68);
  FormatForComparisonFailureMessage<double,double>((double *)value,(double *)pAVar1);
  AssertionResult::operator<<(this,value);
  AssertionResult::AssertionResult(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  AssertionResult::~AssertionResult((AssertionResult *)0x12117c);
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}